

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::setStringImpl(ClipboardImpl *this,String *text)

{
  Window WVar1;
  ostream *poVar2;
  String *text_local;
  ClipboardImpl *this_local;
  
  String::operator=(&this->m_clipboardContents,text);
  XSetSelectionOwner(this->m_display,this->m_clipboard,this->m_window,0);
  WVar1 = XGetSelectionOwner(this->m_display,this->m_clipboard);
  if (WVar1 != this->m_window) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Cannot set clipboard string: Unable to get ownership of X selection");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ClipboardImpl::setStringImpl(const String& text)
{
    m_clipboardContents = text;

    // Set our window as the current owner of the selection
    XSetSelectionOwner(m_display, m_clipboard, m_window, CurrentTime);

    // Check if setting the selection owner was successful
    if (XGetSelectionOwner(m_display, m_clipboard) != m_window)
        err() << "Cannot set clipboard string: Unable to get ownership of X selection" << std::endl;
}